

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# despot.cpp
# Opt level: O1

ValuedAction __thiscall despot::DESPOT::Search(DESPOT *this)

{
  SearchStatistics *statistics;
  DSPOMDP *pDVar1;
  Belief *pBVar2;
  double dVar3;
  double dVar4;
  int iVar5;
  log_ostream *plVar6;
  ostream *poVar7;
  VNode *pVVar8;
  long lVar9;
  SearchStatistics *pSVar10;
  SearchStatistics *pSVar11;
  byte bVar12;
  ValuedAction VVar13;
  vector<despot::State_*,_std::allocator<despot::State_*>_> particles;
  ValuedAction astar;
  timeval tv;
  vector<despot::State_*,_std::allocator<despot::State_*>_> local_d0;
  ValuedAction local_b8;
  SearchStatistics local_a8;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_48;
  
  bVar12 = 0;
  iVar5 = logging::level();
  if (3 < iVar5) {
    pDVar1 = (this->super_Solver).model_;
    (*pDVar1->_vptr_DSPOMDP[0x14])(pDVar1,(this->super_Solver).belief_,&std::cout);
  }
  if (Globals::config <= 0.0) {
    iVar5 = (*((this->super_Solver).model_)->_vptr_DSPOMDP[5])();
    iVar5 = Random::NextInt((Random *)&Random::RANDOM,iVar5);
    ValuedAction::ValuedAction(&local_b8,iVar5,-INFINITY);
    goto LAB_00168a54;
  }
  gettimeofday((timeval *)&local_a8,(__timezone_ptr_t)0x0);
  dVar3 = (double)(long)local_a8.initial_lb;
  dVar4 = (double)(long)local_a8.initial_ub;
  pBVar2 = (this->super_Solver).belief_;
  (*pBVar2->_vptr_Belief[2])(&local_d0,pBVar2,(ulong)(uint)DAT_00193ddc);
  iVar5 = logging::level();
  if (0 < iVar5) {
    iVar5 = logging::level();
    if (2 < iVar5) {
      plVar6 = logging::stream(3);
      std::__ostream_insert<char,std::char_traits<char>>
                (&plVar6->super_ostream,"[DESPOT::Search] Time for sampling ",0x23);
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)plVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," particles: ",0xc);
      gettimeofday((timeval *)&local_a8,(__timezone_ptr_t)0x0);
      poVar7 = std::ostream::_M_insert<double>
                         (((double)(long)local_a8.initial_ub / 1000000.0 +
                          (double)(long)local_a8.initial_lb) - (dVar4 / 1000000.0 + dVar3));
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"s",1);
      std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
    }
  }
  SearchStatistics::SearchStatistics(&local_a8);
  statistics = &this->statistics_;
  pSVar10 = &local_a8;
  pSVar11 = statistics;
  for (lVar9 = 0xc; lVar9 != 0; lVar9 = lVar9 + -1) {
    pSVar11->initial_lb = pSVar10->initial_lb;
    pSVar10 = (SearchStatistics *)((long)pSVar10 + ((ulong)bVar12 * -2 + 1) * 8);
    pSVar11 = (SearchStatistics *)((long)pSVar11 + (ulong)bVar12 * -0x10 + 8);
  }
  gettimeofday((timeval *)&local_a8,(__timezone_ptr_t)0x0);
  dVar3 = (double)(long)local_a8.initial_lb;
  dVar4 = (double)(long)local_a8.initial_ub;
  if (Search()::streams == '\0') {
    iVar5 = __cxa_guard_acquire(&Search()::streams);
    if (iVar5 != 0) {
      RandomStreams::RandomStreams(&Search::streams,DAT_00193ddc,DAT_00193de0);
      __cxa_atexit(RandomStreams::~RandomStreams,&Search::streams,&__dso_handle);
      __cxa_guard_release(&Search()::streams);
    }
  }
  if (this->upper_bound_ == (ScenarioUpperBound *)0x0) {
LAB_001685c1:
    RandomStreams::RandomStreams((RandomStreams *)&local_a8,DAT_00193ddc,DAT_00193de0);
    local_48.
    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         Search::streams.streams_.
         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_48.
    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         Search::streams.streams_.
         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_48.
    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         Search::streams.streams_.
         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    Search::streams.streams_.
    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)local_a8.initial_lb;
    Search::streams.streams_.
    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_a8.initial_ub;
    Search::streams.streams_.
    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_a8.final_lb;
    local_a8.initial_lb = 0.0;
    local_a8.initial_ub = 0.0;
    local_a8.final_lb = 0.0;
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::~vector(&local_48);
    Search::streams.position_ = local_a8.final_ub._0_4_;
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               *)&local_a8);
    (*this->lower_bound_->_vptr_ScenarioLowerBound[2])(this->lower_bound_,&Search::streams);
    (*this->upper_bound_->_vptr_ScenarioUpperBound[2])(this->upper_bound_,&Search::streams);
  }
  else {
    lVar9 = __dynamic_cast(this->upper_bound_,&ScenarioUpperBound::typeinfo,
                           &LookaheadUpperBound::typeinfo,0);
    if (lVar9 == 0) goto LAB_001685c1;
    if (Search()::initialized == '\0') {
      (*this->lower_bound_->_vptr_ScenarioLowerBound[2])(this->lower_bound_,&Search::streams);
      (*this->upper_bound_->_vptr_ScenarioUpperBound[2])(this->upper_bound_,&Search::streams);
      Search()::initialized = '\x01';
    }
  }
  pVVar8 = ConstructTree(&local_d0,&Search::streams,this->lower_bound_,this->upper_bound_,
                         (this->super_Solver).model_,&(this->super_Solver).history_,Globals::config,
                         statistics);
  this->root_ = pVVar8;
  iVar5 = logging::level();
  if (0 < iVar5) {
    iVar5 = logging::level();
    if (2 < iVar5) {
      plVar6 = logging::stream(3);
      std::__ostream_insert<char,std::char_traits<char>>
                (&plVar6->super_ostream,"[DESPOT::Search] Time for tree construction: ",0x2d);
      gettimeofday((timeval *)&local_a8,(__timezone_ptr_t)0x0);
      poVar7 = std::ostream::_M_insert<double>
                         (((double)(long)local_a8.initial_ub / 1000000.0 +
                          (double)(long)local_a8.initial_lb) - (dVar4 / 1000000.0 + dVar3));
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"s",1);
      std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
    }
  }
  gettimeofday((timeval *)&local_a8,(__timezone_ptr_t)0x0);
  dVar3 = (double)(long)local_a8.initial_lb;
  dVar4 = (double)(long)local_a8.initial_ub;
  VNode::Free(this->root_,(this->super_Solver).model_);
  iVar5 = logging::level();
  if (0 < iVar5) {
    iVar5 = logging::level();
    if (2 < iVar5) {
      plVar6 = logging::stream(3);
      std::__ostream_insert<char,std::char_traits<char>>
                (&plVar6->super_ostream,
                 "[DESPOT::Search] Time for freeing particles in search tree: ",0x3c);
      gettimeofday((timeval *)&local_a8,(__timezone_ptr_t)0x0);
      poVar7 = std::ostream::_M_insert<double>
                         (((double)(long)local_a8.initial_ub / 1000000.0 +
                          (double)(long)local_a8.initial_lb) - (dVar4 / 1000000.0 + dVar3));
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"s",1);
      std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
    }
  }
  VVar13 = OptimalAction(this->root_);
  local_b8.action = VVar13.action;
  local_b8.value = VVar13.value;
  gettimeofday((timeval *)&local_a8,(__timezone_ptr_t)0x0);
  dVar3 = (double)(long)local_a8.initial_lb;
  dVar4 = (double)(long)local_a8.initial_ub;
  pVVar8 = this->root_;
  if (pVVar8 != (VNode *)0x0) {
    VNode::~VNode(pVVar8);
    operator_delete(pVVar8,0x98);
  }
  iVar5 = logging::level();
  if (0 < iVar5) {
    iVar5 = logging::level();
    if (2 < iVar5) {
      plVar6 = logging::stream(3);
      std::__ostream_insert<char,std::char_traits<char>>
                (&plVar6->super_ostream,"[DESPOT::Search] Time for deleting tree: ",0x29);
      gettimeofday((timeval *)&local_a8,(__timezone_ptr_t)0x0);
      poVar7 = std::ostream::_M_insert<double>
                         (((double)(long)local_a8.initial_ub / 1000000.0 +
                          (double)(long)local_a8.initial_lb) - (dVar4 / 1000000.0 + dVar3));
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"s",1);
      std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
    }
  }
  iVar5 = logging::level();
  if (0 < iVar5) {
    iVar5 = logging::level();
    if (2 < iVar5) {
      plVar6 = logging::stream(3);
      std::__ostream_insert<char,std::char_traits<char>>
                (&plVar6->super_ostream,"[DESPOT::Search] Search statistics:",0x23);
      std::ios::widen((char)(plVar6->super_ostream)._vptr_basic_ostream[-3] + (char)plVar6);
      std::ostream::put((char)plVar6);
      poVar7 = (ostream *)std::ostream::flush();
      poVar7 = despot::operator<<(poVar7,statistics);
      std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
    }
  }
  if (local_d0.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d0.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_d0.
                          super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_d0.
                          super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
LAB_00168a54:
  VVar13._4_4_ = 0;
  VVar13.action = local_b8.action;
  VVar13.value = local_b8.value;
  return VVar13;
}

Assistant:

ValuedAction DESPOT::Search() {
	if (logging::level() >= logging::DEBUG) {
		model_->PrintBelief(*belief_);
	}

	if (Globals::config.time_per_move <= 0) // Return a random action if no time is allocated for planning
		return ValuedAction(Random::RANDOM.NextInt(model_->NumActions()),
			Globals::NEG_INFTY);

	double start = get_time_second();
	vector<State*> particles = belief_->Sample(Globals::config.num_scenarios);
	logi << "[DESPOT::Search] Time for sampling " << particles.size()
		<< " particles: " << (get_time_second() - start) << "s" << endl;

	statistics_ = SearchStatistics();

	start = get_time_second();
	static RandomStreams streams = RandomStreams(Globals::config.num_scenarios,
		Globals::config.search_depth);

	LookaheadUpperBound* ub = dynamic_cast<LookaheadUpperBound*>(upper_bound_);
	if (ub != NULL) { // Avoid using new streams for LookaheadUpperBound
		static bool initialized = false;
		if (!initialized ) {
			lower_bound_->Init(streams);
			upper_bound_->Init(streams);
			initialized = true;
		}
	} else {
		streams = RandomStreams(Globals::config.num_scenarios,
			Globals::config.search_depth);
		lower_bound_->Init(streams);
		upper_bound_->Init(streams);
	}

	root_ = ConstructTree(particles, streams, lower_bound_, upper_bound_,
		model_, history_, Globals::config.time_per_move, &statistics_);
	logi << "[DESPOT::Search] Time for tree construction: "
		<< (get_time_second() - start) << "s" << endl;

	start = get_time_second();
	root_->Free(*model_);
	logi << "[DESPOT::Search] Time for freeing particles in search tree: "
		<< (get_time_second() - start) << "s" << endl;

	ValuedAction astar = OptimalAction(root_);
	start = get_time_second();
	delete root_;

	logi << "[DESPOT::Search] Time for deleting tree: "
		<< (get_time_second() - start) << "s" << endl;
	logi << "[DESPOT::Search] Search statistics:" << endl << statistics_
		<< endl;

	return astar;
}